

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O1

cmList * __thiscall
cmList::get_items<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (cmList *__return_storage_ptr__,cmList *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  
  std::vector<long,std::allocator<long>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<long,std::allocator<long>> *)local_30,first,last,&local_31);
  GetItems(__return_storage_ptr__,this,(vector<long,_std::allocator<long>_> *)local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

cmList get_items(InputIterator first, InputIterator last) const
  {
    return this->GetItems(std::vector<index_type>{ first, last });
  }